

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::ReLU_x86_avx512::forward_inplace(ReLU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined1 auVar2 [64];
  uint uVar3;
  _func_int **pp_Var4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [64];
  undefined1 auVar16 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar17 [64];
  
  iVar13 = bottom_top_blob->elempack;
  if ((iVar13 == 0) || (iVar11 = (int)bottom_top_blob->elemsize << 3, iVar11 / iVar13 != 8)) {
    uVar3 = bottom_top_blob->c;
    iVar13 = iVar13 * bottom_top_blob->w * bottom_top_blob->h * bottom_top_blob->d;
    pp_Var4 = this->_vptr_ReLU_x86_avx512;
    if (*(float *)(&this->field_0xd0 + (long)pp_Var4[-3]) == 0.0) {
      uVar14 = 0;
      uVar12 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar12 = uVar14;
      }
      for (; uVar14 != uVar12; uVar14 = uVar14 + 1) {
        pauVar15 = (undefined1 (*) [64])
                   (bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        for (iVar11 = 0; iVar11 + 0xf < iVar13; iVar11 = iVar11 + 0x10) {
          auVar16 = vmaxps_avx512f(ZEXT864(0),*pauVar15);
          *pauVar15 = auVar16;
          pauVar15 = pauVar15 + 1;
        }
        for (; iVar11 + 7 < iVar13; iVar11 = iVar11 + 8) {
          auVar20 = vmaxps_avx(ZEXT832(0),*(undefined1 (*) [32])*pauVar15);
          *(undefined1 (*) [32])*pauVar15 = auVar20;
          pauVar15 = (undefined1 (*) [64])(*pauVar15 + 0x20);
        }
        for (; iVar11 + 3 < iVar13; iVar11 = iVar11 + 4) {
          auVar19 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*pauVar15);
          *(undefined1 (*) [16])*pauVar15 = auVar19;
          pauVar15 = (undefined1 (*) [64])(*pauVar15 + 0x10);
        }
        for (; iVar11 < iVar13; iVar11 = iVar11 + 1) {
          auVar19 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(*(uint *)*pauVar15));
          *(int *)*pauVar15 = auVar19._0_4_;
          pauVar15 = (undefined1 (*) [64])(*pauVar15 + 4);
        }
      }
    }
    else {
      uVar14 = 0;
      uVar12 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar12 = uVar14;
      }
      for (; uVar14 != uVar12; uVar14 = uVar14 + 1) {
        pauVar15 = (undefined1 (*) [64])
                   (bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar16 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd0 + (long)pp_Var4[-3])));
        for (iVar11 = 0; iVar11 + 0xf < iVar13; iVar11 = iVar11 + 0x10) {
          auVar2 = *pauVar15;
          uVar10 = vcmpps_avx512f(auVar2,ZEXT864(0),1);
          auVar17 = vmulps_avx512f(auVar2,auVar16);
          bVar5 = (bool)((byte)uVar10 & 1);
          auVar18._0_4_ = (uint)bVar5 * auVar17._0_4_ | (uint)!bVar5 * auVar2._0_4_;
          bVar5 = (bool)((byte)(uVar10 >> 1) & 1);
          auVar18._4_4_ = (uint)bVar5 * auVar17._4_4_ | (uint)!bVar5 * auVar2._4_4_;
          bVar5 = (bool)((byte)(uVar10 >> 2) & 1);
          auVar18._8_4_ = (uint)bVar5 * auVar17._8_4_ | (uint)!bVar5 * auVar2._8_4_;
          bVar5 = (bool)((byte)(uVar10 >> 3) & 1);
          auVar18._12_4_ = (uint)bVar5 * auVar17._12_4_ | (uint)!bVar5 * auVar2._12_4_;
          bVar5 = (bool)((byte)(uVar10 >> 4) & 1);
          auVar18._16_4_ = (uint)bVar5 * auVar17._16_4_ | (uint)!bVar5 * auVar2._16_4_;
          bVar5 = (bool)((byte)(uVar10 >> 5) & 1);
          auVar18._20_4_ = (uint)bVar5 * auVar17._20_4_ | (uint)!bVar5 * auVar2._20_4_;
          bVar5 = (bool)((byte)(uVar10 >> 6) & 1);
          auVar18._24_4_ = (uint)bVar5 * auVar17._24_4_ | (uint)!bVar5 * auVar2._24_4_;
          bVar5 = (bool)((byte)(uVar10 >> 7) & 1);
          auVar18._28_4_ = (uint)bVar5 * auVar17._28_4_ | (uint)!bVar5 * auVar2._28_4_;
          bVar5 = (bool)((byte)(uVar10 >> 8) & 1);
          auVar18._32_4_ = (uint)bVar5 * auVar17._32_4_ | (uint)!bVar5 * auVar2._32_4_;
          bVar5 = (bool)((byte)(uVar10 >> 9) & 1);
          auVar18._36_4_ = (uint)bVar5 * auVar17._36_4_ | (uint)!bVar5 * auVar2._36_4_;
          bVar5 = (bool)((byte)(uVar10 >> 10) & 1);
          auVar18._40_4_ = (uint)bVar5 * auVar17._40_4_ | (uint)!bVar5 * auVar2._40_4_;
          bVar5 = (bool)((byte)(uVar10 >> 0xb) & 1);
          auVar18._44_4_ = (uint)bVar5 * auVar17._44_4_ | (uint)!bVar5 * auVar2._44_4_;
          bVar5 = (bool)((byte)(uVar10 >> 0xc) & 1);
          auVar18._48_4_ = (uint)bVar5 * auVar17._48_4_ | (uint)!bVar5 * auVar2._48_4_;
          bVar5 = (bool)((byte)(uVar10 >> 0xd) & 1);
          auVar18._52_4_ = (uint)bVar5 * auVar17._52_4_ | (uint)!bVar5 * auVar2._52_4_;
          bVar5 = (bool)((byte)(uVar10 >> 0xe) & 1);
          auVar18._56_4_ = (uint)bVar5 * auVar17._56_4_ | (uint)!bVar5 * auVar2._56_4_;
          bVar5 = SUB81(uVar10 >> 0xf,0);
          auVar18._60_4_ = (uint)bVar5 * auVar17._60_4_ | (uint)!bVar5 * auVar2._60_4_;
          *pauVar15 = auVar18;
          pauVar15 = pauVar15 + 1;
        }
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
        auVar20._4_4_ = uVar1;
        auVar20._0_4_ = uVar1;
        auVar20._8_4_ = uVar1;
        auVar20._12_4_ = uVar1;
        auVar20._16_4_ = uVar1;
        auVar20._20_4_ = uVar1;
        auVar20._24_4_ = uVar1;
        auVar20._28_4_ = uVar1;
        for (; iVar11 + 7 < iVar13; iVar11 = iVar11 + 8) {
          auVar7 = vmaxps_avx(*(undefined1 (*) [32])*pauVar15,ZEXT832(0));
          auVar9 = vminps_avx(*(undefined1 (*) [32])*pauVar15,ZEXT832(0));
          auVar19 = vfmadd213ps_fma(auVar9,auVar20,auVar7);
          *(undefined1 (*) [32])*pauVar15 = ZEXT1632(auVar19);
          pauVar15 = (undefined1 (*) [64])(*pauVar15 + 0x20);
        }
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
        auVar19._4_4_ = uVar1;
        auVar19._0_4_ = uVar1;
        auVar19._8_4_ = uVar1;
        auVar19._12_4_ = uVar1;
        for (; iVar11 + 3 < iVar13; iVar11 = iVar11 + 4) {
          auVar6 = vmaxps_avx(*(undefined1 (*) [16])*pauVar15,ZEXT816(0));
          auVar8 = vminps_avx(*(undefined1 (*) [16])*pauVar15,ZEXT816(0));
          auVar6 = vfmadd213ps_fma(auVar8,auVar19,auVar6);
          *(undefined1 (*) [16])*pauVar15 = auVar6;
          pauVar15 = (undefined1 (*) [64])(*pauVar15 + 0x10);
        }
        for (; iVar11 < iVar13; iVar11 = iVar11 + 1) {
          if (*(float *)*pauVar15 < 0.0) {
            *(float *)*pauVar15 =
                 *(float *)*pauVar15 * *(float *)(&this->field_0xd0 + (long)pp_Var4[-3]);
          }
          pauVar15 = (undefined1 (*) [64])(*pauVar15 + 4);
        }
      }
    }
  }
  else {
    forward_inplace_int8(this,bottom_top_blob,(Option *)((long)iVar11 % (long)iVar13 & 0xffffffff));
  }
  return 0;
}

Assistant:

int ReLU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int elembits = bottom_top_blob.elembits();

    if (elembits == 8)
        return forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, _mm512_max_ps(_zero_avx512, _p));
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, _mm256_max_ps(_zero_avx, _p));
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                _mm_store_ps(ptr, _mm_max_ps(_zero, _p));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *ptr = std::max(*ptr, 0.f);
                ptr++;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            __m512 _slope_avx512 = _mm512_set1_ps(slope);
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __mmask16 _is_negative = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_LT_OQ);
                _p = _mm512_mask_mul_ps(_p, _is_negative, _p, _slope_avx512);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            __m256 _slope_avx = _mm256_set1_ps(slope);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _pos = _mm256_max_ps(_zero_avx, _p);
                __m256 _neg = _mm256_min_ps(_zero_avx, _p);
                _p = _mm256_add_ps(_pos, _mm256_mul_ps(_slope_avx, _neg));
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            __m128 _slope = _mm_set1_ps(slope);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _pos = _mm_max_ps(_zero, _p);
                __m128 _neg = _mm_min_ps(_zero, _p);
                _p = _mm_add_ps(_pos, _mm_mul_ps(_slope, _neg));
                _mm_store_ps(ptr, _p);
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}